

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O1

void __thiscall spv::Function::setDebugLineInfo(Function *this,Id fileName,int line,int column)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  
  pIVar2 = (Instruction *)operator_new(0x60);
  pIVar2->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
  pIVar2->resultId = 0;
  pIVar2->typeId = 0;
  pIVar2->opCode = OpLine;
  (pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  *(undefined8 *)
   &(pIVar2->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl = 0;
  (pIVar2->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar2->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl = 0;
  (pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar2->block = (Block *)0x0;
  pIVar1 = (this->lineInstruction)._M_t.
           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
           super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  (this->lineInstruction)._M_t.
  super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = pIVar2;
  if (pIVar1 != (Instruction *)0x0) {
    (*pIVar1->_vptr_Instruction[1])();
  }
  pIVar1 = (this->lineInstruction)._M_t.
           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
           super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar1->operands,3);
  if ((pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage ==
      *(_Bit_pointer *)&(pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl) {
    std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar1->idOperand,3);
  }
  Instruction::addIdOperand
            ((this->lineInstruction)._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,fileName);
  Instruction::addImmediateOperand
            ((this->lineInstruction)._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,line);
  Instruction::addImmediateOperand
            ((this->lineInstruction)._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,column);
  return;
}

Assistant:

void setDebugLineInfo(Id fileName, int line, int column) {
        lineInstruction = std::unique_ptr<Instruction>{new Instruction(OpLine)};
        lineInstruction->reserveOperands(3);
        lineInstruction->addIdOperand(fileName);
        lineInstruction->addImmediateOperand(line);
        lineInstruction->addImmediateOperand(column);
    }